

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  StkId pSVar4;
  Proto *pPVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  Table *t;
  StkId pSVar11;
  size_t srclen;
  byte *pbVar12;
  char *pcVar13;
  CallInfo *pCVar14;
  ulong uVar15;
  long lVar16;
  Table *x_;
  int local_64;
  byte *local_60;
  TValue local_40;
  
  if (*what == '>') {
    pSVar11 = (StkId)((L->top).offset + -0x10);
    local_60 = (byte *)(what + 1);
    (L->top).p = pSVar11;
    pCVar14 = (CallInfo *)0x0;
  }
  else {
    pCVar14 = ar->i_ci;
    pSVar11 = (pCVar14->func).p;
    local_60 = (byte *)what;
  }
  if (((pSVar11->val).tt_ | 0x20) == 0x66) {
    lVar16 = *(long *)pSVar11;
  }
  else {
    lVar16 = 0;
  }
  local_64 = 1;
  pbVar12 = local_60;
  do {
    bVar6 = *pbVar12;
    if (bVar6 < 0x66) {
      if (bVar6 != 0x4c) {
        if (bVar6 != 0x53) {
          if (bVar6 == 0) {
            pcVar13 = strchr((char *)local_60,0x66);
            if (pcVar13 != (char *)0x0) {
              pSVar4 = (L->top).p;
              *(Value *)pSVar4 = (pSVar11->val).value_;
              (pSVar4->val).tt_ = (pSVar11->val).tt_;
              (L->top).p = (StkId)((L->top).offset + 0x10);
            }
            pcVar13 = strchr((char *)local_60,0x4c);
            if (pcVar13 != (char *)0x0) {
              if ((lVar16 == 0) || (*(char *)(lVar16 + 8) != '\x06')) {
                *(undefined1 *)((L->top).offset + 8) = 0;
                (L->top).p = (StkId)((L->top).offset + 0x10);
              }
              else {
                pPVar5 = *(Proto **)(lVar16 + 0x18);
                iVar8 = pPVar5->linedefined;
                t = luaH_new(L);
                pSVar11 = (L->top).p;
                *(Table **)pSVar11 = t;
                (pSVar11->val).tt_ = 'E';
                (L->top).p = (StkId)((L->top).offset + 0x10);
                if (pPVar5->lineinfo != (char *)0x0) {
                  local_40.tt_ = '\x11';
                  if (pPVar5->is_vararg == '\0') {
                    uVar9 = 0;
                  }
                  else {
                    iVar7 = (int)*pPVar5->lineinfo;
                    if (iVar7 == -0x80) {
                      iVar8 = luaG_getfuncline(pPVar5,0);
                    }
                    else {
                      iVar8 = iVar8 + iVar7;
                    }
                    uVar9 = 1;
                  }
                  if ((int)uVar9 < pPVar5->sizelineinfo) {
                    uVar15 = (ulong)uVar9;
                    do {
                      if (pPVar5->lineinfo[uVar15] == -0x80) {
                        iVar8 = luaG_getfuncline(pPVar5,(int)uVar15);
                      }
                      else {
                        iVar8 = iVar8 + pPVar5->lineinfo[uVar15];
                      }
                      luaH_setint(L,t,(long)iVar8,&local_40);
                      uVar15 = uVar15 + 1;
                    } while ((int)uVar15 < pPVar5->sizelineinfo);
                  }
                }
              }
            }
            return local_64;
          }
          goto switchD_0013f36d_caseD_6d;
        }
        if ((lVar16 == 0) || (*(char *)(lVar16 + 8) != '\x06')) {
          pcVar13 = "=[C]";
          ar->source = "=[C]";
          ar->srclen = 4;
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          srclen = 4;
          pcVar10 = "C";
        }
        else {
          lVar1 = *(long *)(lVar16 + 0x18);
          lVar2 = *(long *)(lVar1 + 0x70);
          if (lVar2 == 0) {
            pcVar13 = "=?";
            ar->source = "=?";
            srclen = 2;
          }
          else {
            pcVar13 = (char *)(lVar2 + 0x18);
            ar->source = pcVar13;
            srclen = (size_t)*(byte *)(lVar2 + 0xb);
            if (srclen == 0xff) {
              srclen = *(size_t *)(lVar2 + 0x10);
            }
          }
          ar->srclen = srclen;
          uVar3 = *(undefined8 *)(lVar1 + 0x2c);
          ar->linedefined = (int)uVar3;
          ar->lastlinedefined = (int)((ulong)uVar3 >> 0x20);
          pcVar10 = "Lua";
          if ((int)uVar3 == 0) {
            pcVar10 = "main";
          }
        }
        ar->what = pcVar10;
        luaO_chunkid(ar->short_src,pcVar13,srclen);
      }
    }
    else {
      switch(bVar6) {
      case 0x6c:
        iVar8 = -1;
        if ((pCVar14 != (CallInfo *)0x0) && ((pCVar14->callstatus & 2) == 0)) {
          pPVar5 = *(Proto **)((((pCVar14->func).p)->val).value_.f + 0x18);
          iVar8 = luaG_getfuncline(pPVar5,(int)((ulong)((long)(pCVar14->u).l.savedpc -
                                                       (long)pPVar5->code) >> 2) + -1);
        }
        ar->currentline = iVar8;
        break;
      case 0x6d:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0013f36d_caseD_6d:
        local_64 = 0;
        break;
      case 0x6e:
        if ((pCVar14 != (CallInfo *)0x0) && ((pCVar14->callstatus & 0x20) == 0)) {
          pcVar13 = funcnamefromcall(L,pCVar14->previous,&ar->name);
          ar->namewhat = pcVar13;
          if (pcVar13 != (char *)0x0) break;
        }
        ar->namewhat = "";
        ar->name = (char *)0x0;
        break;
      case 0x72:
        if ((pCVar14 == (CallInfo *)0x0) || ((pCVar14->callstatus & 0x100) == 0)) {
          ar->ftransfer = 0;
          ar->ntransfer = 0;
        }
        else {
          ar->ftransfer = (pCVar14->u2).transferinfo.ftransfer;
          ar->ntransfer = (pCVar14->u2).transferinfo.ntransfer;
        }
        break;
      case 0x74:
        if (pCVar14 == (CallInfo *)0x0) {
          bVar6 = 0;
        }
        else {
          bVar6 = (byte)pCVar14->callstatus & 0x20;
        }
        ar->istailcall = bVar6;
        break;
      case 0x75:
        if (lVar16 == 0) {
          ar->nups = '\0';
        }
        else {
          ar->nups = *(uchar *)(lVar16 + 10);
          if (*(char *)(lVar16 + 8) == '\x06') {
            ar->isvararg = *(char *)(*(long *)(lVar16 + 0x18) + 0xb);
            ar->nparams = *(uchar *)(*(long *)(lVar16 + 0x18) + 10);
            break;
          }
        }
        ar->nparams = '\0';
        ar->isvararg = '\x01';
        break;
      default:
        if (bVar6 != 0x66) goto switchD_0013f36d_caseD_6d;
      }
    }
    pbVar12 = pbVar12 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}